

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

void __thiscall gl4cts::ShaderSubroutine::FunctionalTest17::deinit(FunctionalTest17 *this)

{
  int iVar1;
  deUint32 dVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar3 + 0x470))();
    this->m_gs_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar3 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_tc_id != 0) {
    (**(code **)(lVar3 + 0x470))();
    this->m_tc_id = 0;
  }
  if (this->m_te_id != 0) {
    (**(code **)(lVar3 + 0x470))();
    this->m_te_id = 0;
  }
  if (this->m_to_data != (float *)0x0) {
    operator_delete__(this->m_to_data);
    this->m_to_data = (float *)0x0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))();
    this->m_vs_id = 0;
  }
  (**(code **)(lVar3 + 0xfd8))(0x8e72,3);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteri() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2323);
  (**(code **)(lVar3 + 0xff0))(0xd05,4);
  dVar2 = (**(code **)(lVar3 + 0x800))();
  glu::checkError(dVar2,"glPixelStorei() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x2326);
  return;
}

Assistant:

void FunctionalTest17::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);

		m_gs_id = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_tc_id != 0)
	{
		gl.deleteShader(m_tc_id);

		m_tc_id = 0;
	}

	if (m_te_id != 0)
	{
		gl.deleteShader(m_te_id);

		m_te_id = 0;
	}

	if (m_to_data != DE_NULL)
	{
		delete[] m_to_data;

		m_to_data = DE_NULL;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}

	/* Restore original GL configuration */
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteri() call failed.");

	gl.pixelStorei(GL_PACK_ALIGNMENT, 4);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");
}